

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkCollapse_rec(Cba_Ntk_t *pNew,Cba_Ntk_t *p,Vec_Int_t *vSigs)

{
  char cVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  Cba_Ntk_t *p_00;
  long lVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  
  uVar4 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar4) {
    piVar5 = (p->vObjCopy).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar4 << 2);
    }
    (p->vObjCopy).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_00335fcc;
    (p->vObjCopy).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar4 * 4);
  }
  (p->vObjCopy).nSize = uVar4;
  uVar4 = (p->vFonObj).nCap;
  if ((p->vFonCopy).nCap < (int)uVar4) {
    piVar5 = (p->vFonCopy).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar4 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar4 << 2);
    }
    (p->vFonCopy).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
LAB_00335fcc:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonCopy).nCap = uVar4;
  }
  if (0 < (int)uVar4) {
    memset((p->vFonCopy).pArray,0,(ulong)uVar4 * 4);
  }
  (p->vFonCopy).nSize = uVar4;
  if (vSigs->nSize != (p->vInputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x2e3,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
  }
  if (0 < vSigs->nSize) {
    piVar5 = (p->vInputs).pArray;
    lVar8 = 0;
    do {
      iVar9 = piVar5[lVar8];
      if ((long)iVar9 < 1) {
LAB_00335f12:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if (((p->vObjFon0).nSize <= iVar9) || (vSigs->nSize <= lVar8)) goto LAB_00335e65;
      uVar4 = (p->vObjFon0).pArray[iVar9];
      if ((int)uVar4 < 1) goto LAB_00335e8d;
      if ((p->vFonCopy).nSize <= (int)uVar4) goto LAB_00335e65;
      piVar2 = (p->vFonCopy).pArray;
      if (piVar2[uVar4] != 0) goto LAB_00335e84;
      piVar2[uVar4] = vSigs->pArray[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vInputs).nSize);
  }
  uVar4 = (p->vObjType).nSize;
  uVar14 = (ulong)uVar4;
  if (1 < (int)uVar4) {
    lVar8 = 1;
    do {
      if ((int)uVar14 <= lVar8) goto LAB_00335f31;
      cVar1 = (p->vObjType).pArray[lVar8];
      if (cVar1 != '\0') {
        if ((byte)(cVar1 + 0xa6U) < 0xaa) {
          if (cVar1 == '\x03') {
            lVar6 = (long)(p->vObjFon0).nSize;
            if ((lVar6 <= lVar8) || (lVar6 <= lVar8 + 1)) goto LAB_00335e65;
            uVar4 = (p->vObjFon0).pArray[lVar8];
            uVar14 = (ulong)uVar4;
            while ((int)uVar14 < (p->vObjFon0).pArray[lVar8 + 1]) {
              uVar3 = Cba_ObjAlloc(pNew,CBA_BOX_BUF,1,1);
              if ((int)uVar3 < 1) goto LAB_00335f12;
              if ((pNew->vObjFon0).nSize <= (int)uVar3) goto LAB_00335e65;
              if ((int)uVar4 < 1) goto LAB_00335e8d;
              if ((p->vFonCopy).nSize <= (int)uVar14) goto LAB_00335e65;
              piVar5 = (p->vFonCopy).pArray;
              if (piVar5[uVar14] != 0) goto LAB_00335e84;
              piVar5[uVar14] = (pNew->vObjFon0).pArray[uVar3];
              uVar14 = uVar14 + 1;
              if ((long)(p->vObjFon0).nSize <= lVar8 + 1) goto LAB_00335e65;
            }
          }
        }
        else {
          iVar9 = (int)lVar8;
          uVar4 = Cba_ObjDup(pNew,p,iVar9);
          lVar6 = (long)(p->vObjFon0).nSize;
          if ((lVar6 <= lVar8) || (lVar7 = lVar8 + 1, lVar6 <= lVar7)) goto LAB_00335e65;
          piVar5 = (p->vObjFon0).pArray;
          uVar3 = piVar5[lVar8];
          uVar14 = (ulong)uVar3;
          iVar11 = 0;
          while ((int)uVar14 < piVar5[lVar8 + 1]) {
            if ((int)uVar4 < 1) {
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x157,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
            }
            if ((pNew->vObjFon0).nSize <= (int)uVar4) goto LAB_00335e65;
            if ((int)uVar3 < 1) goto LAB_00335e8d;
            if ((p->vFonCopy).nSize <= (int)uVar14) goto LAB_00335e65;
            piVar2 = (p->vFonCopy).pArray;
            if (piVar2[uVar14] != 0) goto LAB_00335e84;
            piVar2[uVar14] = (pNew->vObjFon0).pArray[uVar4] + iVar11;
            uVar14 = uVar14 + 1;
            iVar11 = iVar11 + 1;
            if ((p->vObjFon0).nSize <= lVar7) goto LAB_00335e65;
          }
          if (0 < (p->vObjAttr).nSize) {
            Vec_IntFillExtra(&p->vObjAttr,(int)lVar7,0);
            if ((p->vObjAttr).nSize <= lVar8) goto LAB_00335e65;
            if ((p->vObjAttr).pArray[lVar8] != 0) {
              piVar5 = Cba_ObjAttrArray(p,iVar9);
              iVar9 = Cba_ObjAttrSize(p,iVar9);
              Cba_ObjSetAttrs(pNew,uVar4,piVar5,iVar9);
            }
          }
        }
      }
      lVar8 = lVar8 + 1;
      iVar9 = (p->vObjType).nSize;
      uVar14 = (ulong)iVar9;
    } while (lVar8 < (long)uVar14);
    if (1 < iVar9) {
      lVar8 = 1;
      do {
        if ((int)uVar14 <= lVar8) {
LAB_00335f31:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        cVar1 = (p->vObjType).pArray[lVar8];
        if (cVar1 != '\0') {
          if ((byte)(cVar1 + 0xa6U) < 0xaa) {
            if (cVar1 == '\x03') {
              vSigs->nSize = 0;
              lVar6 = (long)(p->vObjFin0).nSize;
              if ((lVar6 <= lVar8) || (lVar7 = lVar8 + 1, lVar6 <= lVar7)) goto LAB_00335e65;
              uVar4 = (p->vObjFin0).pArray[lVar8];
              uVar14 = (ulong)uVar4;
              while( true ) {
                piVar5 = (p->vObjFin0).pArray;
                iVar9 = piVar5[lVar8 + 1];
                if (iVar9 <= (int)uVar14) break;
                if ((int)uVar4 < 1) goto LAB_00335eac;
                if ((p->vFinFon).nSize <= (int)uVar14) goto LAB_00335e65;
                iVar9 = (p->vFinFon).pArray[uVar14];
                if (0 < (long)iVar9) {
                  if ((p->vFonCopy).nSize <= iVar9) goto LAB_00335e65;
                  iVar9 = (p->vFonCopy).pArray[iVar9];
                }
                Vec_IntPush(vSigs,iVar9);
                uVar14 = uVar14 + 1;
                if ((p->vObjFin0).nSize <= lVar7) goto LAB_00335e65;
              }
              if (vSigs->nSize != iVar9 - piVar5[lVar8]) {
                __assert_fail("Vec_IntSize(vSigs) == Cba_ObjFinNum(p, iObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                              ,0x305,
                              "void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
              }
              if ((p->vObjType).nSize <= lVar8) goto LAB_00335f31;
              if (((p->vObjType).pArray[lVar8] == '\x03') && (0 < (p->vObjFunc).nSize)) {
                Vec_IntFillExtra(&p->vObjFunc,(int)lVar7,0);
                if ((p->vObjFunc).nSize <= lVar8) goto LAB_00335e65;
                iVar9 = (p->vObjFunc).pArray[lVar8];
                if (((long)iVar9 < 1) || ((p->pDesign->vNtks).nSize <= iVar9)) goto LAB_00335cda;
                p_00 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[iVar9];
              }
              else {
LAB_00335cda:
                p_00 = (Cba_Ntk_t *)0x0;
              }
              Cba_NtkCollapse_rec(pNew,p_00,vSigs);
              if ((p->vObjFon0).nSize <= lVar7) goto LAB_00335e65;
              piVar5 = (p->vObjFon0).pArray;
              uVar4 = piVar5[lVar8];
              if (vSigs->nSize != piVar5[lVar8 + 1] - uVar4) {
                __assert_fail("Vec_IntSize(vSigs) == Cba_ObjFonNum(p, iObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                              ,0x307,
                              "void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
              }
              lVar6 = 0;
              while( true ) {
                uVar14 = (ulong)uVar4 + lVar6;
                iVar9 = (int)uVar14;
                if (piVar5[lVar8 + 1] <= iVar9) break;
                uVar3 = 0;
                if (0 < iVar9) {
                  if ((p->vFonCopy).nSize <= iVar9) goto LAB_00335e65;
                  iVar9 = (p->vFonCopy).pArray[uVar14 & 0xffffffff];
                  uVar3 = 0;
                  if (0 < (long)iVar9) {
                    if ((pNew->vFonObj).nSize <= iVar9) goto LAB_00335e65;
                    uVar3 = (pNew->vFonObj).pArray[iVar9];
                  }
                }
                if (vSigs->nSize <= lVar6) goto LAB_00335e65;
                if ((int)uVar3 < 1) goto LAB_00335ef3;
                if ((pNew->vObjFin0).nSize <= (int)uVar3) goto LAB_00335e65;
                iVar9 = (pNew->vObjFin0).pArray[uVar3];
                lVar10 = (long)iVar9;
                if (lVar10 < 1) goto LAB_00335eac;
                if ((pNew->vFinFon).nSize <= iVar9) goto LAB_00335e65;
                piVar2 = (pNew->vFinFon).pArray;
                if (piVar2[lVar10] != 0) goto LAB_00335eea;
                piVar2[lVar10] = vSigs->pArray[lVar6];
                lVar6 = lVar6 + 1;
                if ((p->vObjFon0).nSize <= lVar7) goto LAB_00335e65;
              }
            }
          }
          else {
            if ((p->vObjCopy).nSize < 1) {
              __assert_fail("Cba_NtkHasObjCopies(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x15b,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
            }
            lVar6 = lVar8 + 1;
            Vec_IntFillExtra(&p->vObjCopy,(int)lVar6,-1);
            if ((((p->vObjCopy).nSize <= lVar8) ||
                (lVar7 = (long)(p->vObjFin0).nSize, lVar7 <= lVar8)) || (lVar7 <= lVar6))
            goto LAB_00335e65;
            uVar4 = (p->vObjCopy).pArray[lVar8];
            piVar5 = (p->vObjFin0).pArray;
            uVar3 = piVar5[lVar8];
            uVar14 = (ulong)uVar3;
            iVar9 = 0;
            while ((int)uVar14 < piVar5[lVar8 + 1]) {
              if ((int)uVar3 < 1) goto LAB_00335eac;
              if ((p->vFinFon).nSize <= (int)uVar14) goto LAB_00335e65;
              iVar11 = (p->vFinFon).pArray[uVar14];
              if (0 < (long)iVar11) {
                if ((p->vFonCopy).nSize <= iVar11) goto LAB_00335e65;
                iVar11 = (p->vFonCopy).pArray[iVar11];
              }
              if ((int)uVar4 < 1) goto LAB_00335ef3;
              if ((pNew->vObjFin0).nSize <= (int)uVar4) goto LAB_00335e65;
              uVar13 = (pNew->vObjFin0).pArray[uVar4] + iVar9;
              if ((int)uVar13 < 1) goto LAB_00335eac;
              if ((pNew->vFinFon).nSize <= (int)uVar13) goto LAB_00335e65;
              piVar2 = (pNew->vFinFon).pArray;
              if (piVar2[uVar13] != 0) goto LAB_00335eea;
              piVar2[uVar13] = iVar11;
              uVar14 = uVar14 + 1;
              iVar9 = iVar9 + 1;
              if ((p->vObjFin0).nSize <= lVar6) goto LAB_00335e65;
            }
          }
        }
        lVar8 = lVar8 + 1;
        uVar14 = (ulong)(p->vObjType).nSize;
      } while (lVar8 < (long)uVar14);
    }
  }
  vSigs->nSize = 0;
  if (0 < (p->vOutputs).nSize) {
    lVar8 = 0;
    do {
      iVar9 = (p->vOutputs).pArray[lVar8];
      if ((long)iVar9 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16b,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((p->vObjFin0).nSize <= iVar9) {
LAB_00335e65:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = (p->vObjFin0).pArray[iVar9];
      if ((long)iVar9 < 1) {
LAB_00335eac:
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((p->vFinFon).nSize <= iVar9) goto LAB_00335e65;
      iVar9 = (p->vFinFon).pArray[iVar9];
      if (0 < (long)iVar9) {
        if ((p->vFonCopy).nSize <= iVar9) goto LAB_00335e65;
        iVar9 = (p->vFonCopy).pArray[iVar9];
      }
      Vec_IntPush(vSigs,iVar9);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vOutputs).nSize);
  }
  return;
LAB_00335e8d:
  pcVar12 = "Cba_FonIsReal(f)";
  goto LAB_00335e94;
LAB_00335ef3:
  pcVar12 = "i>0";
  goto LAB_00335efa;
LAB_00335e84:
  pcVar12 = "Cba_FonCopy(p, f) == 0";
LAB_00335e94:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x189,"void Cba_FonSetCopy(Cba_Ntk_t *, int, int)");
LAB_00335eea:
  pcVar12 = "Cba_ObjFinFon(p, i, k)== 0";
LAB_00335efa:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x16e,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
}

Assistant:

void Cba_NtkCollapse_rec( Cba_Ntk_t * pNew, Cba_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, iObj, iObjNew, iFin, iFon;
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    // set PI copies
    assert( Vec_IntSize(vSigs) == Cba_NtkPiNum(p) );
    Cba_NtkForEachPiFon( p, iObj, iFon, i )
        Cba_FonSetCopy( p, iFon, Vec_IntEntry(vSigs, i) );
    // duplicate primitives and create buffers for user instances
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim( p, iObj ) )
        {
            iObjNew = Cba_ObjDup( pNew, p, iObj );
            Cba_ObjForEachFon( p, iObj, iFon, i )
                Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, i) );
            if ( Cba_ObjAttr(p, iObj) )
                Cba_ObjSetAttrs( pNew, iObjNew, Cba_ObjAttrArray(p, iObj), Cba_ObjAttrSize(p, iObj) );
        }
        else if ( Cba_ObjIsBoxUser( p, iObj ) )
        {
            Cba_ObjForEachFon( p, iObj, iFon, i )
            {
                iObjNew = Cba_ObjAlloc( pNew, CBA_BOX_BUF, 1, 1 );
                Cba_FonSetCopy( p, iFon, Cba_ObjFon0(pNew, iObjNew) );
            }
        }
    // connect primitives and collapse user instances
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim( p, iObj ) )
        {
            iObjNew = Cba_ObjCopy( p, iObj );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
                Cba_ObjSetFinFon( pNew, iObjNew, i, Cba_FonCopy(p, iFon) );
        }
        else if ( Cba_ObjIsBoxUser( p, iObj ) )
        {
            Vec_IntClear( vSigs );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
                Vec_IntPush( vSigs, Cba_FonCopy(p, iFon) );
            assert( Vec_IntSize(vSigs) == Cba_ObjFinNum(p, iObj) );
            Cba_NtkCollapse_rec( pNew, Cba_ObjNtk(p, iObj), vSigs );
            assert( Vec_IntSize(vSigs) == Cba_ObjFonNum(p, iObj) );
            Cba_ObjForEachFon( p, iObj, iFon, i )
            {
                iObjNew = Cba_FonObj( pNew, Cba_FonCopy(p, iFon) ); // buffer
                Cba_ObjSetFinFon( pNew, iObjNew, 0, Vec_IntEntry(vSigs, i) );
            }
        }
    // collect POs
    Vec_IntClear( vSigs );
    Cba_NtkForEachPoDriverFon( p, iObj, iFon, i )
        Vec_IntPush( vSigs, Cba_FonCopy(p, iFon) );
}